

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCnf.c
# Opt level: O3

void Ssw_CnfNodeAddToSolver(Ssw_Sat_t *p,Aig_Obj_t *pObj)

{
  size_t sVar1;
  Vec_Int_t *pVVar2;
  Aig_Obj_t *pNode;
  int iVar3;
  Vec_Ptr_t *vFrontier;
  void **ppvVar4;
  ulong uVar5;
  int in_EDX;
  undefined8 extraout_RDX;
  Vec_Ptr_t *pVVar6;
  undefined8 extraout_RDX_00;
  ulong uVar7;
  undefined8 extraout_RDX_01;
  undefined8 uVar8;
  uint uVar9;
  long lVar10;
  void *pvVar11;
  long lVar12;
  
  pVVar2 = p->vSatVars;
  iVar3 = pObj->Id;
  Vec_IntFillExtra(pVVar2,iVar3 + 1,in_EDX);
  if ((-1 < (long)iVar3) && (iVar3 < pVVar2->nSize)) {
    if (pVVar2->pArray[iVar3] != 0) {
      return;
    }
    vFrontier = (Vec_Ptr_t *)malloc(0x10);
    vFrontier->nCap = 100;
    vFrontier->nSize = 0;
    ppvVar4 = (void **)malloc(800);
    vFrontier->pArray = ppvVar4;
    Ssw_ObjAddToFrontier(p,pObj,vFrontier);
    if (0 < vFrontier->nSize) {
      lVar10 = 0;
      uVar8 = extraout_RDX;
      do {
        pNode = (Aig_Obj_t *)vFrontier->pArray[lVar10];
        pVVar2 = p->vSatVars;
        iVar3 = pNode->Id;
        Vec_IntFillExtra(pVVar2,iVar3 + 1,(int)uVar8);
        if (((long)iVar3 < 0) || (pVVar2->nSize <= iVar3)) goto LAB_005e5372;
        if (pVVar2->pArray[iVar3] == 0) {
          __assert_fail("Ssw_ObjSatNum(p,pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswCnf.c"
                        ,0x16e,"void Ssw_CnfNodeAddToSolver(Ssw_Sat_t *, Aig_Obj_t *)");
        }
        iVar3 = Aig_ObjIsMuxType(pNode);
        pVVar6 = p->vFanins;
        if (iVar3 == 0) {
          Ssw_CollectSuper(pNode,1,pVVar6);
          pVVar6 = p->vFanins;
          if (0 < pVVar6->nSize) {
            lVar12 = 0;
            do {
              Ssw_ObjAddToFrontier
                        (p,(Aig_Obj_t *)((ulong)pVVar6->pArray[lVar12] & 0xfffffffffffffffe),
                         vFrontier);
              lVar12 = lVar12 + 1;
              pVVar6 = p->vFanins;
            } while (lVar12 < pVVar6->nSize);
          }
          Ssw_AddClausesSuper(p,pNode,pVVar6);
          uVar8 = extraout_RDX_00;
        }
        else {
          pVVar6->nSize = 0;
          uVar7 = *(ulong *)(((ulong)pNode->pFanin0 & 0xfffffffffffffffe) + 8);
          iVar3 = 0;
          ppvVar4 = pVVar6->pArray;
          if (pVVar6->nCap == 0) {
            if (ppvVar4 == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
              iVar3 = 0;
            }
            else {
              ppvVar4 = (void **)realloc(ppvVar4,0x80);
              iVar3 = pVVar6->nSize;
            }
            pVVar6->pArray = ppvVar4;
            pVVar6->nCap = 0x10;
          }
          pVVar6->nSize = iVar3 + 1;
          ppvVar4[iVar3] = (void *)(uVar7 & 0xfffffffffffffffe);
          pVVar6 = p->vFanins;
          pvVar11 = (void *)(*(ulong *)(((ulong)pNode->pFanin1 & 0xfffffffffffffffe) + 8) &
                            0xfffffffffffffffe);
          uVar9 = pVVar6->nSize;
          uVar7 = (ulong)uVar9;
          if (0 < (int)uVar9) {
            uVar5 = 0;
            do {
              if (pVVar6->pArray[uVar5] == pvVar11) goto LAB_005e5184;
              uVar5 = uVar5 + 1;
            } while (uVar7 != uVar5);
          }
          if (uVar9 == pVVar6->nCap) {
            if ((int)uVar9 < 0x10) {
              if (pVVar6->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(0x80);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar6->pArray,0x80);
              }
              pVVar6->pArray = ppvVar4;
              pVVar6->nCap = 0x10;
            }
            else {
              if (pVVar6->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(uVar7 << 4);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar6->pArray,uVar7 << 4);
              }
              pVVar6->pArray = ppvVar4;
              pVVar6->nCap = uVar9 * 2;
            }
          }
          else {
            ppvVar4 = pVVar6->pArray;
          }
          iVar3 = pVVar6->nSize;
          pVVar6->nSize = iVar3 + 1;
          ppvVar4[iVar3] = pvVar11;
          pVVar6 = p->vFanins;
          uVar7 = (ulong)(uint)pVVar6->nSize;
LAB_005e5184:
          pvVar11 = (void *)(*(ulong *)(((ulong)pNode->pFanin0 & 0xfffffffffffffffe) + 0x10) &
                            0xfffffffffffffffe);
          uVar9 = (uint)uVar7;
          if (0 < (int)uVar9) {
            uVar5 = 0;
            do {
              if (pVVar6->pArray[uVar5] == pvVar11) goto LAB_005e523a;
              uVar5 = uVar5 + 1;
            } while (uVar7 != uVar5);
          }
          if (uVar9 == pVVar6->nCap) {
            if ((int)uVar9 < 0x10) {
              if (pVVar6->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(0x80);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar6->pArray,0x80);
              }
              pVVar6->pArray = ppvVar4;
              pVVar6->nCap = 0x10;
            }
            else {
              sVar1 = (ulong)(uVar9 * 2) * 8;
              if (pVVar6->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(sVar1);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar6->pArray,sVar1);
              }
              pVVar6->pArray = ppvVar4;
              pVVar6->nCap = uVar9 * 2;
            }
          }
          else {
            ppvVar4 = pVVar6->pArray;
          }
          iVar3 = pVVar6->nSize;
          pVVar6->nSize = iVar3 + 1;
          ppvVar4[iVar3] = pvVar11;
          pVVar6 = p->vFanins;
          uVar9 = pVVar6->nSize;
LAB_005e523a:
          pvVar11 = (void *)(*(ulong *)(((ulong)pNode->pFanin1 & 0xfffffffffffffffe) + 0x10) &
                            0xfffffffffffffffe);
          if (0 < (int)uVar9) {
            uVar7 = 0;
            do {
              if (pVVar6->pArray[uVar7] == pvVar11) goto LAB_005e52fd;
              uVar7 = uVar7 + 1;
            } while (uVar9 != uVar7);
          }
          if (uVar9 == pVVar6->nCap) {
            if ((int)uVar9 < 0x10) {
              if (pVVar6->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(0x80);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar6->pArray,0x80);
              }
              pVVar6->pArray = ppvVar4;
              pVVar6->nCap = 0x10;
            }
            else {
              sVar1 = (ulong)(uVar9 * 2) * 8;
              if (pVVar6->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(sVar1);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar6->pArray,sVar1);
              }
              pVVar6->pArray = ppvVar4;
              pVVar6->nCap = uVar9 * 2;
            }
          }
          else {
            ppvVar4 = pVVar6->pArray;
          }
          iVar3 = pVVar6->nSize;
          pVVar6->nSize = iVar3 + 1;
          ppvVar4[iVar3] = pvVar11;
          pVVar6 = p->vFanins;
          if (0 < pVVar6->nSize) {
LAB_005e52fd:
            lVar12 = 0;
            do {
              Ssw_ObjAddToFrontier
                        (p,(Aig_Obj_t *)((ulong)pVVar6->pArray[lVar12] & 0xfffffffffffffffe),
                         vFrontier);
              lVar12 = lVar12 + 1;
              pVVar6 = p->vFanins;
            } while (lVar12 < pVVar6->nSize);
          }
          Ssw_AddClausesMux(p,pNode);
          uVar8 = extraout_RDX_01;
        }
        if (p->vFanins->nSize < 2) {
          __assert_fail("Vec_PtrSize(p->vFanins) > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswCnf.c"
                        ,0x181,"void Ssw_CnfNodeAddToSolver(Ssw_Sat_t *, Aig_Obj_t *)");
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < vFrontier->nSize);
    }
    if (vFrontier->pArray != (void **)0x0) {
      free(vFrontier->pArray);
    }
    free(vFrontier);
    return;
  }
LAB_005e5372:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Ssw_CnfNodeAddToSolver( Ssw_Sat_t * p, Aig_Obj_t * pObj )
{
    Vec_Ptr_t * vFrontier;
    Aig_Obj_t * pNode, * pFanin;
    int i, k, fUseMuxes = 1;
    // quit if CNF is ready
    if ( Ssw_ObjSatNum(p,pObj) )
        return;
    // start the frontier
    vFrontier = Vec_PtrAlloc( 100 );
    Ssw_ObjAddToFrontier( p, pObj, vFrontier );
    // explore nodes in the frontier
    Vec_PtrForEachEntry( Aig_Obj_t *, vFrontier, pNode, i )
    {
        // create the supergate
        assert( Ssw_ObjSatNum(p,pNode) );
        if ( fUseMuxes && Aig_ObjIsMuxType(pNode) )
        {
            Vec_PtrClear( p->vFanins );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin0( Aig_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin0( Aig_ObjFanin1(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin1( Aig_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin1( Aig_ObjFanin1(pNode) ) );
            Vec_PtrForEachEntry( Aig_Obj_t *, p->vFanins, pFanin, k )
                Ssw_ObjAddToFrontier( p, Aig_Regular(pFanin), vFrontier );
            Ssw_AddClausesMux( p, pNode );
        }
        else
        {
            Ssw_CollectSuper( pNode, fUseMuxes, p->vFanins );
            Vec_PtrForEachEntry( Aig_Obj_t *, p->vFanins, pFanin, k )
                Ssw_ObjAddToFrontier( p, Aig_Regular(pFanin), vFrontier );
            Ssw_AddClausesSuper( p, pNode, p->vFanins );
        }
        assert( Vec_PtrSize(p->vFanins) > 1 );
    }
    Vec_PtrFree( vFrontier );
}